

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

void char_from_room(CHAR_DATA *ch)

{
  short *psVar1;
  ROOM_INDEX_DATA *room;
  ROOM_INDEX_DATA *pRVar2;
  CHAR_DATA *pCVar3;
  bool bVar4;
  CHAR_DATA **ppCVar5;
  short sVar6;
  ROOM_AFFECT_DATA *pRVar7;
  AFFECT_DATA *pAVar8;
  byte bVar9;
  CHAR_DATA *pCVar10;
  ROOM_AFFECT_DATA *af;
  OBJ_DATA *obj;
  string_view fmt;
  
  room = ch->in_room;
  if (room == (ROOM_INDEX_DATA *)0x0) {
    fmt._M_str = "Char_from_room: nullptr.";
    fmt._M_len = 0x18;
    CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt);
    return;
  }
  bVar4 = is_npc(ch);
  if (!bVar4) {
    psVar1 = &ch->in_room->area->nplayer;
    *psVar1 = *psVar1 + -1;
  }
  obj = ch->carrying;
  if (obj != (OBJ_DATA *)0x0) {
    do {
      if ((obj->wear_loc != -1) &&
         (((obj->item_type == 1 || (bVar4 = is_obj_stat(obj,0), bVar4)) &&
          (pRVar2 = ch->in_room, pRVar2 != (ROOM_INDEX_DATA *)0x0)))) {
        sVar6 = pRVar2->light;
        if (pRVar2->light < 4) {
          sVar6 = 3;
        }
        pRVar2->light = sVar6 + -3;
      }
      obj = obj->next_content;
    } while (obj != (OBJ_DATA *)0x0);
  }
  pRVar2 = ch->in_room;
  pCVar3 = pRVar2->people;
  if ((ch->progtypes[0] & 0x200) != 0) {
    if (pCVar3 != (CHAR_DATA *)0x0) {
      bVar9 = 0;
      pCVar10 = pCVar3;
      do {
        if (pCVar10 != ch) {
          bVar9 = bVar9 | (*(byte *)((long)pCVar10->progtypes + 1) & 2) >> 1;
        }
        pCVar10 = pCVar10->next_in_room;
      } while (pCVar10 != (CHAR_DATA *)0x0);
      if (bVar9 != 0) goto LAB_0029efe8;
    }
    pRVar2->move_progs = false;
  }
LAB_0029efe8:
  if (pCVar3 == ch) {
    ppCVar5 = &pRVar2->people;
  }
  else {
    do {
      pCVar10 = pCVar3;
      if (pCVar10 == (CHAR_DATA *)0x0) goto LAB_0029f036;
      pCVar3 = pCVar10->next_in_room;
    } while (pCVar10->next_in_room != ch);
    ppCVar5 = &pCVar10->next_in_room;
  }
  *ppCVar5 = ch->next_in_room;
LAB_0029f036:
  ch->next_in_room = (CHAR_DATA *)0x0;
  ch->on = (OBJ_DATA *)0x0;
  ch->in_room = (ROOM_INDEX_DATA *)0x0;
  af = (ROOM_AFFECT_DATA *)&room->affected;
  pRVar7 = af;
  do {
    pRVar7 = pRVar7->next;
    if (pRVar7 == (ROOM_AFFECT_DATA *)0x0) goto LAB_0029f088;
  } while (pRVar7->type != gsn_gravity_well);
  do {
    af = af->next;
    if (af == (ROOM_AFFECT_DATA *)0x0) break;
  } while (af->type != gsn_gravity_well);
  if (af->owner == ch) {
    gravity_well_explode(room,af);
  }
LAB_0029f088:
  if (ch == (CHAR_DATA *)0x0) {
LAB_0029f0af:
    bVar4 = check_entwine(ch,1);
    if ((bVar4) || (bVar4 = check_entwine(ch,2), bVar4)) {
      pAVar8 = (AFFECT_DATA *)&ch->affected;
      do {
        do {
          pAVar8 = pAVar8->next;
        } while (pAVar8->type != gsn_entwine);
      } while ((pAVar8->modifier != 1) && (pAVar8->location != 2));
      ch = pAVar8->owner;
      goto LAB_0029f13e;
    }
  }
  else {
    pAVar8 = (AFFECT_DATA *)&ch->affected;
    do {
      pAVar8 = pAVar8->next;
      if (pAVar8 == (AFFECT_DATA *)0x0) goto LAB_0029f0af;
    } while (pAVar8->type != gsn_pull);
  }
  if (ch == (CHAR_DATA *)0x0) {
LAB_0029f126:
    bVar4 = check_entwine(ch,0);
    if (bVar4) {
LAB_0029f13e:
      do_uncoil(ch,"automagic");
      return;
    }
  }
  else {
    pAVar8 = (AFFECT_DATA *)&ch->affected;
    do {
      pAVar8 = pAVar8->next;
      if (pAVar8 == (AFFECT_DATA *)0x0) goto LAB_0029f126;
    } while (pAVar8->type != gsn_pull);
  }
  return;
}

Assistant:

void char_from_room(CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *prev_room = ch->in_room;
	ROOM_AFFECT_DATA *af;
	OBJ_DATA *obj;
	CHAR_DATA *mob;
	bool other= false;
	AFFECT_DATA *aaf;

	if (ch->in_room == nullptr)
	{
		RS.Logger.Debug("Char_from_room: nullptr.");
		return;
	}

	if (!is_npc(ch))
		--ch->in_room->area->nplayer;

	for (obj = ch->carrying; obj; obj = obj->next_content)
	{
		if (obj->wear_loc != WEAR_NONE)
		{
			if ((obj->item_type == ITEM_LIGHT || is_obj_stat(obj, ITEM_GLOW)) && ch->in_room)
				ch->in_room->light = std::max(0, ch->in_room->light - 3);
		}
	}

	if (IS_SET(ch->progtypes, MPROG_MOVE))
	{
		for (mob = ch->in_room->people; mob; mob = mob->next_in_room)
		{
			if (mob != ch && IS_SET(mob->progtypes, MPROG_MOVE))
				other = true;
		}

		if (!other)
			ch->in_room->move_progs = false;
	}

	if (ch == ch->in_room->people)
	{
		ch->in_room->people = ch->next_in_room;
	}
	else
	{
		CHAR_DATA *prev;

		for (prev = ch->in_room->people; prev; prev = prev->next_in_room)
		{
			if (prev->next_in_room == ch)
			{
				prev->next_in_room = ch->next_in_room;
				break;
			}
		}
		/*
		if ( prev == nullptr )
			RS.Logger.Warn("Char_from_room: ch not found.");
		*/
	}

	ch->in_room = nullptr;
	ch->next_in_room = nullptr;
	ch->on = nullptr; /* sanity check! */

	if (is_affected_room(prev_room, gsn_gravity_well))
	{
		for (af = prev_room->affected; af != nullptr; af = af->next)
		{
			if (af->type == gsn_gravity_well)
				break;
		}

		if (ch == af->owner)
			gravity_well_explode(prev_room, af);
	}
	if (!is_affected(ch, gsn_pull) && (check_entwine(ch, 1) || check_entwine(ch, 2)))
	{
		for (aaf = ch->affected; aaf != nullptr; aaf = aaf->next)
		{
			if (aaf->type == gsn_entwine && (aaf->modifier == 1 || aaf->location == APPLY_DEX))
				break;
		}

		do_uncoil(aaf->owner, "automagic");
	}
	else if (!is_affected(ch, gsn_pull) && check_entwine(ch, 0))
	{
		do_uncoil(ch, "automagic");
	}
}